

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  ImVec2 *in_RDI;
  float _x;
  float _y;
  float a;
  int i;
  ImVec2 *local_30;
  ImVec2 local_28;
  float local_20;
  int local_1c;
  ImVec2 local_18;
  ImVec2 local_10;
  
  ImVec2::ImVec2(in_RDI);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 3));
  local_30 = in_RDI + 5;
  do {
    ImVec2::ImVec2(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != in_RDI + 0x11);
  in_RDI[1].x = 0.0;
  in_RDI[1].y = 0.0;
  in_RDI[2].x = 0.0;
  in_RDI[2].y = 0.0;
  ImVec4::ImVec4((ImVec4 *)&local_18,-8192.0,-8192.0,8192.0,8192.0);
  in_RDI[3] = local_18;
  in_RDI[4] = local_10;
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    local_20 = ((float)local_1c * 2.0 * 3.1415927) / 12.0;
    _x = ImCos(0.0);
    _y = ImSin(0.0);
    ImVec2::ImVec2(&local_28,_x,_y);
    in_RDI[(long)local_1c + 5] = local_28;
  }
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    Font = NULL;
    FontSize = 0.0f;
    CurveTessellationTol = 0.0f;
    ClipRectFullscreen = ImVec4(-8192.0f, -8192.0f, +8192.0f, +8192.0f);

    // Const data
    for (int i = 0; i < IM_ARRAYSIZE(CircleVtx12); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(CircleVtx12);
        CircleVtx12[i] = ImVec2(ImCos(a), ImSin(a));
    }
}